

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

bool __thiscall tf::Executor::_invoke_subflow_task(Executor *this,Worker *worker,Node *node)

{
  function<void_(tf::Subflow_&)> *this_00;
  byte *pbVar1;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  beg;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  end;
  uint uVar2;
  function<void_(tf::Subflow_&)> *this_01;
  Subflow sf;
  Subflow local_50;
  
  this_01 = (function<void_(tf::Subflow_&)> *)0x0;
  if (*(__index_type *)
       ((long)&(node->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       + 0x38) == '\x03') {
    this_01 = (function<void_(tf::Subflow_&)> *)&node->_handle;
  }
  this_00 = this_01 + 0x20;
  uVar2 = node->_nstate;
  if ((uVar2 >> 0x1d & 1) == 0) {
    node->_nstate = uVar2 & 0x1fffffff;
    local_50.super_FlowBuilder._graph = (Graph *)this_00;
    local_50._executor = this;
    local_50._worker = worker;
    local_50._parent = node;
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::clear((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             *)this_00);
    _observer_prologue(this,worker,node);
    std::function<void_(tf::Subflow_&)>::operator()(this_01,&local_50);
    _observer_epilogue(this,worker,node);
    if (-1 < (local_50._parent)->_nstate) {
      beg._M_current = *(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> **)(this_01 + 0x20);
      end._M_current = *(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> **)(this_01 + 0x28);
      if (end._M_current != beg._M_current) {
        pbVar1 = (byte *)((long)&node->_nstate + 3);
        *pbVar1 = *pbVar1 | 0x20;
        _schedule_graph_with_parent<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                  (this,worker,beg,end,node);
        return true;
      }
    }
    uVar2 = node->_nstate;
  }
  else {
    uVar2 = uVar2 & 0xdfffffff;
    node->_nstate = uVar2;
  }
  if ((uVar2 >> 0x1e & 1) == 0) {
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::clear((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             *)this_00);
  }
  return false;
}

Assistant:

inline bool Executor::_invoke_subflow_task(Worker& worker, Node* node) {
    
  auto& h = *std::get_if<Node::Subflow>(&node->_handle);
  auto& g = h.subgraph;

  if((node->_nstate & NSTATE::PREEMPTED) == 0) {
    
    // set up the subflow
    Subflow sf(*this, worker, node, g);

    // invoke the subflow callable
    _observer_prologue(worker, node);
    TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
      h.work(sf);
    });
    _observer_epilogue(worker, node);
    
    // spawn the subflow if it is joinable and its graph is non-empty
    // implicit join is faster than Subflow::join as it does not involve corun
    if(sf.joinable() && g.size()) {

      // signal the executor to preempt this node
      node->_nstate |= NSTATE::PREEMPTED;

      // set up and schedule the graph
      _schedule_graph_with_parent(worker, g.begin(), g.end(), node);
      return true;
    }
  }
  else {
    node->_nstate &= ~NSTATE::PREEMPTED;
  }

  // the subflow has finished or joined
  if((node->_nstate & NSTATE::RETAIN_SUBFLOW) == 0) {
    g.clear();
  }

  return false;
}